

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng_rect.cc
# Opt level: O0

bool __thiscall S2LatLngRect::Intersects(S2LatLngRect *this,S2Cell *cell)

{
  S2Cell *pSVar1;
  bool bVar2;
  VType *a_00;
  VType *b_00;
  long lVar3;
  double dVar4;
  double p2;
  S2LatLng *local_210;
  VType *local_1f8;
  S2Point *b;
  S2Point *a;
  S1Angle local_1b0;
  undefined1 local_1a8 [8];
  S1Interval edge_lng;
  undefined1 auStack_190 [4];
  int i_1;
  S2Point local_180;
  S2LatLng local_168;
  S2Point local_158;
  int local_13c;
  undefined1 local_138 [4];
  int i;
  S2LatLng cell_ll [4];
  S2Point cell_v [4];
  S2LatLngRect local_88;
  R2Point local_60;
  S2Point local_50;
  S2Point local_38;
  S2Cell *local_20;
  S2Cell *cell_local;
  S2LatLngRect *this_local;
  
  local_20 = cell;
  cell_local = (S2Cell *)this;
  bVar2 = is_empty(this);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    S2Cell::GetCenterRaw(&local_38,local_20);
    bVar2 = Contains(this,&local_38);
    pSVar1 = local_20;
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      local_60.c_ = (VType  [2])GetCenter(this);
      S2LatLng::ToPoint(&local_50,(S2LatLng *)&local_60);
      bVar2 = S2Cell::Contains(pSVar1,&local_50);
      if (bVar2) {
        this_local._7_1_ = true;
      }
      else {
        S2Cell::GetRectBound(&local_88,local_20);
        bVar2 = Intersects(this,&local_88);
        ~S2LatLngRect(&local_88);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_1f8 = cell_ll[3].coords_.c_ + 1;
          do {
            Vector3<double>::Vector3((Vector3<double> *)local_1f8);
            local_1f8 = local_1f8 + 3;
          } while (local_1f8 != cell_v[3].c_ + 2);
          local_210 = (S2LatLng *)local_138;
          do {
            S2LatLng::S2LatLng(local_210);
            local_210 = local_210 + 1;
          } while (local_210 != (S2LatLng *)(cell_ll[3].coords_.c_ + 1));
          for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
            S2Cell::GetVertex(&local_158,local_20,local_13c);
            lVar3 = (long)local_13c;
            cell_v[lVar3 + -1].c_[2] = local_158.c_[0];
            cell_v[lVar3].c_[0] = local_158.c_[1];
            cell_v[lVar3].c_[1] = local_158.c_[2];
            S2LatLng::S2LatLng(&local_168,(S2Point *)(cell_v[(long)local_13c + -1].c_ + 2));
            *(VType *)(local_138 + (long)local_13c * 0x10) = local_168.coords_.c_[0];
            cell_ll[local_13c].coords_.c_[0] = local_168.coords_.c_[1];
            bVar2 = Contains(this,(S2LatLng *)(local_138 + (long)local_13c * 0x10));
            pSVar1 = local_20;
            if (bVar2) {
              return true;
            }
            _auStack_190 = (VType  [2])GetVertex(this,local_13c);
            S2LatLng::ToPoint(&local_180,(S2LatLng *)auStack_190);
            bVar2 = S2Cell::Contains(pSVar1,&local_180);
            if (bVar2) {
              return true;
            }
          }
          for (edge_lng.bounds_.c_[1]._4_4_ = 0; edge_lng.bounds_.c_[1]._4_4_ < 4;
              edge_lng.bounds_.c_[1]._4_4_ = edge_lng.bounds_.c_[1]._4_4_ + 1) {
            local_1b0 = S2LatLng::lng((S2LatLng *)
                                      (local_138 + (long)edge_lng.bounds_.c_[1]._4_4_ * 0x10));
            dVar4 = S1Angle::radians(&local_1b0);
            a = (S2Point *)
                S2LatLng::lng((S2LatLng *)
                              (local_138 + (long)(int)(edge_lng.bounds_.c_[1]._4_4_ + 1U & 3) * 0x10
                              ));
            p2 = S1Angle::radians((S1Angle *)&a);
            _local_1a8 = S1Interval::FromPointPair(dVar4,p2);
            bVar2 = S1Interval::Intersects(&this->lng_,(S1Interval *)local_1a8);
            if (bVar2) {
              a_00 = cell_v[(long)edge_lng.bounds_.c_[1]._4_4_ + -1].c_ + 2;
              b_00 = cell_v[(long)(int)(edge_lng.bounds_.c_[1]._4_4_ + 1U & 3) + -1].c_ + 2;
              dVar4 = S1Interval::lo(&this->lng_);
              bVar2 = S1Interval::Contains((S1Interval *)local_1a8,dVar4);
              if (bVar2) {
                dVar4 = S1Interval::lo(&this->lng_);
                bVar2 = IntersectsLngEdge((S2Point *)a_00,(S2Point *)b_00,&this->lat_,dVar4);
                if (bVar2) {
                  return true;
                }
              }
              dVar4 = S1Interval::hi(&this->lng_);
              bVar2 = S1Interval::Contains((S1Interval *)local_1a8,dVar4);
              if (bVar2) {
                dVar4 = S1Interval::hi(&this->lng_);
                bVar2 = IntersectsLngEdge((S2Point *)a_00,(S2Point *)b_00,&this->lat_,dVar4);
                if (bVar2) {
                  return true;
                }
              }
              dVar4 = R1Interval::lo(&this->lat_);
              bVar2 = IntersectsLatEdge((S2Point *)a_00,(S2Point *)b_00,dVar4,&this->lng_);
              if (bVar2) {
                return true;
              }
              dVar4 = R1Interval::hi(&this->lat_);
              bVar2 = IntersectsLatEdge((S2Point *)a_00,(S2Point *)b_00,dVar4,&this->lng_);
              if (bVar2) {
                return true;
              }
            }
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2LatLngRect::Intersects(const S2Cell& cell) const {
  // First we eliminate the cases where one region completely contains the
  // other.  Once these are disposed of, then the regions will intersect
  // if and only if their boundaries intersect.

  if (is_empty()) return false;
  if (Contains(cell.GetCenterRaw())) return true;
  if (cell.Contains(GetCenter().ToPoint())) return true;

  // Quick rejection test (not required for correctness).
  if (!Intersects(cell.GetRectBound())) return false;

  // Precompute the cell vertices as points and latitude-longitudes.  We also
  // check whether the S2Cell contains any corner of the rectangle, or
  // vice-versa, since the edge-crossing tests only check the edge interiors.

  S2Point cell_v[4];
  S2LatLng cell_ll[4];
  for (int i = 0; i < 4; ++i) {
    cell_v[i] = cell.GetVertex(i);  // Must be normalized.
    cell_ll[i] = S2LatLng(cell_v[i]);
    if (Contains(cell_ll[i])) return true;
    if (cell.Contains(GetVertex(i).ToPoint())) return true;
  }

  // Now check whether the boundaries intersect.  Unfortunately, a
  // latitude-longitude rectangle does not have straight edges -- two edges
  // are curved, and at least one of them is concave.

  for (int i = 0; i < 4; ++i) {
    S1Interval edge_lng = S1Interval::FromPointPair(
        cell_ll[i].lng().radians(), cell_ll[(i+1)&3].lng().radians());
    if (!lng_.Intersects(edge_lng)) continue;

    const S2Point& a = cell_v[i];
    const S2Point& b = cell_v[(i+1)&3];
    if (edge_lng.Contains(lng_.lo())) {
      if (IntersectsLngEdge(a, b, lat_, lng_.lo())) return true;
    }
    if (edge_lng.Contains(lng_.hi())) {
      if (IntersectsLngEdge(a, b, lat_, lng_.hi())) return true;
    }
    if (IntersectsLatEdge(a, b, lat_.lo(), lng_)) return true;
    if (IntersectsLatEdge(a, b, lat_.hi(), lng_)) return true;
  }
  return false;
}